

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BigIndex __thiscall Js::JavascriptArray::BigIndex::operator+(BigIndex *this,BigIndex *delta)

{
  uint uVar1;
  uint32 delta_00;
  uint64 uVar2;
  uint64 uVar3;
  BigIndex BVar4;
  BigIndex local_28;
  
  if (delta->index == 0xffffffff) {
    uVar1 = this->index;
    if ((ulong)uVar1 == 0xffffffff) {
      uVar2 = this->bigIndex;
      uVar3 = GetBigIndex(delta);
      uVar2 = uVar2 + uVar3;
    }
    else {
      uVar2 = GetBigIndex(delta);
      uVar2 = uVar1 + uVar2;
    }
    BigIndex(&local_28,uVar2);
  }
  else {
    delta_00 = GetSmallIndex(delta);
    BVar4 = operator+(this,delta_00);
    local_28.bigIndex = BVar4.bigIndex;
    local_28.index = BVar4.index;
  }
  BVar4._4_4_ = 0;
  BVar4.index = local_28.index;
  BVar4.bigIndex = local_28.bigIndex;
  return BVar4;
}

Assistant:

JavascriptArray::BigIndex JavascriptArray::BigIndex::operator+(const BigIndex& delta) const
    {
        if (delta.IsSmallIndex())
        {
            return operator+(delta.GetSmallIndex());
        }
        if (IsSmallIndex())
        {
            return index + delta.GetBigIndex();
        }

        return bigIndex + delta.GetBigIndex();
    }